

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_BoxArray.cpp
# Opt level: O0

void __thiscall amrex::BARef::define(BARef *this,istream *is,int *ndims)

{
  bool bVar1;
  void *pvVar2;
  istream *piVar3;
  streamoff sVar4;
  iterator msg;
  ulong uVar5;
  int *in_RDX;
  vector<amrex::Box,_std::allocator<amrex::Box>_> *in_RSI;
  undefined1 auVar6 [16];
  iterator End;
  iterator it;
  int ic;
  int itmp;
  char c2;
  char c1;
  pos_type pos;
  ULong tmphash;
  int maxbox;
  vector<amrex::Box,_std::allocator<amrex::Box>_> *in_stack_ffffffffffffff88;
  BARef *in_stack_ffffffffffffff90;
  vector<amrex::Box,_std::allocator<amrex::Box>_> *__lhs;
  __normal_iterator<amrex::Box_*,_std::vector<amrex::Box,_std::allocator<amrex::Box>_>_> local_58;
  int local_4c;
  int local_48;
  char local_42;
  char local_41;
  undefined8 local_40;
  Box *b;
  istream *in_stack_ffffffffffffffd0;
  int local_24;
  int *local_20;
  vector<amrex::Box,_std::allocator<amrex::Box>_> *local_18;
  char *local_8;
  
  local_20 = in_RDX;
  local_18 = in_RSI;
  pvVar2 = (void *)std::istream::ignore((long)in_RSI,100000);
  pvVar2 = (void *)std::istream::operator>>(pvVar2,&local_24);
  std::istream::operator>>(pvVar2,(ulong *)&stack0xffffffffffffffd0);
  resize(in_stack_ffffffffffffff90,(Long)in_stack_ffffffffffffff88);
  auVar6 = std::istream::tellg();
  b = auVar6._8_8_;
  local_40 = auVar6._0_8_;
  *local_20 = 3;
  piVar3 = (istream *)std::istream::operator>>(local_18,std::ws<char,std::char_traits<char>>);
  piVar3 = std::operator>>(piVar3,&local_41);
  piVar3 = (istream *)std::istream::operator>>(piVar3,std::ws<char,std::char_traits<char>>);
  std::operator>>(piVar3,&local_42);
  if ((local_41 == '(') && (local_42 == '(')) {
    std::istream::operator>>(local_18,&local_48);
    *local_20 = 1;
    std::istream::operator>>(local_18,std::ws<char,std::char_traits<char>>);
    local_4c = std::istream::peek();
    if (local_4c == 0x2c) {
      std::istream::ignore((long)local_18,100000);
      std::istream::operator>>(local_18,&local_48);
      *local_20 = *local_20 + 1;
      std::istream::operator>>(local_18,std::ws<char,std::char_traits<char>>);
      local_4c = std::istream::peek();
      if (local_4c == 0x2c) {
        *local_20 = *local_20 + 1;
      }
    }
  }
  __lhs = local_18;
  sVar4 = std::fpos::operator_cast_to_long((fpos *)&local_40);
  std::istream::seekg((long)__lhs,(_Ios_Seekdir)sVar4);
  local_58._M_current =
       (Box *)std::vector<amrex::Box,_std::allocator<amrex::Box>_>::begin(in_stack_ffffffffffffff88)
  ;
  msg = std::vector<amrex::Box,_std::allocator<amrex::Box>_>::end(in_stack_ffffffffffffff88);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<amrex::Box_*,_std::vector<amrex::Box,_std::allocator<amrex::Box>_>_>
                             *)__lhs,(__normal_iterator<amrex::Box_*,_std::vector<amrex::Box,_std::allocator<amrex::Box>_>_>
                                      *)in_stack_ffffffffffffff88), bVar1) {
    in_stack_ffffffffffffff88 = local_18;
    __gnu_cxx::
    __normal_iterator<amrex::Box_*,_std::vector<amrex::Box,_std::allocator<amrex::Box>_>_>::
    operator*(&local_58);
    amrex::operator>>(in_stack_ffffffffffffffd0,b);
    __gnu_cxx::
    __normal_iterator<amrex::Box_*,_std::vector<amrex::Box,_std::allocator<amrex::Box>_>_>::
    operator++(&local_58);
  }
  std::istream::ignore((long)local_18,100000);
  uVar5 = std::ios::fail();
  if ((uVar5 & 1) != 0) {
    local_8 = "BoxArray::define(istream&) failed";
    Error_host((char *)msg._M_current);
  }
  return;
}

Assistant:

void
BARef::define (std::istream& is, int& ndims)
{
    //
    // TODO -- completely remove the fiction of a hash value.
    //
    BL_ASSERT(m_abox.size() == 0);
    int   maxbox;
    ULong tmphash;
    is.ignore(bl_ignore_max, '(') >> maxbox >> tmphash;
    resize(maxbox);
    auto pos = is.tellg();
    {
        ndims = AMREX_SPACEDIM;
        char c1, c2;
        int itmp;
        is >> std::ws >> c1 >> std::ws >> c2;
        if (c1 == '(' && c2 == '(') {
            is >> itmp;
            ndims = 1;
#if (AMREX_SPACEDIM >= 2)
            is >> std::ws;
            int ic = is.peek();
            if (ic == static_cast<int>(',')) {
                is.ignore(BL_IGNORE_MAX, ',');
                is >> itmp;
                ++ndims;
#if (AMREX_SPACEDIM == 3)
                is >> std::ws;
                ic = is.peek();
                if (ic == static_cast<int>(',')) {
                    ++ndims;
                }
#endif
            }
#endif
        }
    }
    is.seekg(pos, std::ios_base::beg);
    for (Vector<Box>::iterator it = m_abox.begin(), End = m_abox.end(); it != End; ++it)
        is >> *it;
    is.ignore(bl_ignore_max, ')');
    if (is.fail())
        amrex::Error("BoxArray::define(istream&) failed");
}